

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_decoder.cc
# Opt level: O3

SpeechType webrtc::AudioDecoder::ConvertSpeechType(int16_t type)

{
  if ((ushort)type < 3) {
    return *(SpeechType *)(&DAT_0019f528 + (ulong)(ushort)type * 4);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/audio_decoder.cc"
                ,0x62,
                "static AudioDecoder::SpeechType webrtc::AudioDecoder::ConvertSpeechType(int16_t)");
}

Assistant:

AudioDecoder::SpeechType AudioDecoder::ConvertSpeechType(int16_t type) {
  switch (type) {
    case 0:  // TODO(hlundin): Both iSAC and Opus return 0 for speech.
    case 1:
      return kSpeech;
    case 2:
      return kComfortNoise;
    default:
      assert(false);
      return kSpeech;
  }
}